

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_parse.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JLWalsh[P]Chapman/test/tests_parse.c"
            );
  UnityDefaultTestRun(test_can_parse_number_without_decimals,
                      "test_can_parse_number_without_decimals",0x30);
  UnityDefaultTestRun(test_can_parse_number_with_decimals,"test_can_parse_number_with_decimals",0x31
                     );
  UnityDefaultTestRun(test_cannot_parse_number_with_missing_decimals,
                      "test_cannot_parse_number_with_missing_decimals",0x32);
  UnityDefaultTestRun(test_can_parse_string,"test_can_parse_string",0x33);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void) {
    UNITY_BEGIN();
    RUN_TEST(test_can_parse_number_without_decimals);
    RUN_TEST(test_can_parse_number_with_decimals);
    RUN_TEST(test_cannot_parse_number_with_missing_decimals);
    RUN_TEST(test_can_parse_string);

    return UNITY_END();
}